

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

void adapt::cuf::Print<char_const(&)[131]>(ostream *ost,char (*args) [131])

{
  tuple<const_char_(&)[131]> local_80;
  tuple<std::basic_ostream<char,_std::char_traits<char>_>_&,_const_adapt::cuf::detail::print::Delimiter<32>_&,_const_adapt::cuf::detail::print::End<10>_&,_const_bool_&>
  local_78;
  __type local_58;
  PrintToStream local_29;
  undefined8 local_28;
  unsigned_long n;
  bool f;
  __tuple_element_t<1UL,_tuple<Delimiter<32>,_End<10>,_IntegralConstant<bool,_false>,_IntegralConstant<unsigned_long,_1UL>_>_>
  e;
  __tuple_element_t<0UL,_tuple<Delimiter<32>,_End<10>,_IntegralConstant<bool,_false>,_IntegralConstant<unsigned_long,_1UL>_>_>
  d;
  char (*pacStack_18) [131];
  tuple<adapt::cuf::detail::print::Delimiter<32>,_adapt::cuf::detail::print::End<10>,_adapt::cuf::IntegralConstant<bool,_false>,_adapt::cuf::IntegralConstant<unsigned_long,_1UL>_>
  t;
  char (*args_local) [131];
  ostream *ost_local;
  
  n._7_1_ = 0;
  n._6_1_ = 0;
  n._5_1_ = 0;
  n._4_1_ = 0;
  local_28 = 1;
  pacStack_18 = args;
  std::
  forward_as_tuple<std::ostream&,adapt::cuf::detail::print::Delimiter<32>const&,adapt::cuf::detail::print::End<10>const&,bool_const&>
            (&local_78,ost,(Delimiter<32> *)((long)&n + 6),(End<10> *)((long)&n + 5),
             (bool *)((long)&n + 4));
  GetFrontArgs<1ul,char_const(&)[131]>((cuf *)&local_80,pacStack_18);
  std::
  tuple_cat<std::tuple<std::ostream&,adapt::cuf::detail::print::Delimiter<32>const&,adapt::cuf::detail::print::End<10>const&,bool_const&>,std::tuple<char_const(&)[131]>,void>
            (&local_58,&local_78,&local_80);
  Apply<adapt::cuf::detail::PrintToStream,std::tuple<std::ostream&,adapt::cuf::detail::print::Delimiter<32>const&,adapt::cuf::detail::print::End<10>const&,bool_const&,char_const(&)[131]>>
            (&local_29,&local_58);
  return;
}

Assistant:

void Print(std::ostream& ost, Args&& ...args)
{
	constexpr auto t = detail::GetOptions<std::decay_t<Args>...>();
	constexpr auto d = std::get<0>(t);
	constexpr auto e = std::get<1>(t);
	constexpr auto f = std::get<2>(t).value;
	constexpr auto n = std::get<3>(t).value;
	Apply(detail::PrintToStream(), std::tuple_cat(std::forward_as_tuple(ost, d, e, f), GetFrontArgs<n>(std::forward<Args>(args)...)));
}